

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int encode_client_hello(ptls_context_t *ctx,ptls_buffer_t *sendbuf,encode_ch_mode mode,
                       int is_second_flight,ptls_handshake_properties_t *properties,
                       void *client_random,ptls_key_exchange_context_t *key_share_ctx,char *sni_name
                       ,ptls_iovec_t legacy_session_id,st_ptls_ech_t *ech,size_t *ech_size_offset,
                       ptls_iovec_t ech_replay,ptls_iovec_t psk_secret,ptls_iovec_t psk_identity,
                       uint32_t obfuscated_ticket_age,size_t psk_binder_size,ptls_iovec_t *cookie,
                       int using_early_data)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  ushort uVar4;
  uint8_t *puVar5;
  ptls_iovec_t *ppVar6;
  ptls_key_exchange_algorithm_t *ppVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  ptls_cipher_suite_t *ppVar14;
  ulong uVar15;
  long lVar16;
  size_t sVar17;
  size_t sVar18;
  uint16_t *puVar19;
  size_t sVar20;
  uint16_t uVar21;
  ptls_cipher_suite_t **pppVar22;
  size_t sVar23;
  bool bVar24;
  ptls_key_exchange_algorithm_t **local_78;
  int local_70;
  int local_5c;
  size_t local_58;
  uint local_44;
  size_t local_40;
  size_t local_38;
  
  if (ech == (st_ptls_ech_t *)0x0 && mode != ENCODE_CH_MODE_INNER) {
    __assert_fail("mode == ENCODE_CH_MODE_INNER || ech != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                  ,0x86d,
                  "int encode_client_hello(ptls_context_t *, ptls_buffer_t *, enum encode_ch_mode, int, ptls_handshake_properties_t *, const void *, ptls_key_exchange_context_t *, const char *, ptls_iovec_t, struct st_ptls_ech_t *, size_t *, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, uint32_t, size_t, ptls_iovec_t *, int)"
                 );
  }
  iVar12 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
  if (iVar12 == 0) {
    sendbuf->base[sendbuf->off] = '\x01';
    sendbuf->off = sendbuf->off + 1;
    iVar12 = 0;
  }
  if (iVar12 != 0) {
    return iVar12;
  }
  iVar12 = ptls_buffer_reserve_aligned(sendbuf,3,'\0');
  if (iVar12 == 0) {
    puVar5 = sendbuf->base;
    sVar17 = sendbuf->off;
    puVar5[sVar17 + 2] = '\0';
    puVar5 = puVar5 + sVar17;
    puVar5[0] = '\0';
    puVar5[1] = '\0';
    sendbuf->off = sendbuf->off + 3;
    iVar12 = 0;
  }
  if (iVar12 != 0) {
    return iVar12;
  }
  sVar17 = sendbuf->off;
  iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
  if (iVar12 == 0) {
    puVar5 = sendbuf->base;
    sVar18 = sendbuf->off;
    (puVar5 + sVar18)[0] = '\x03';
    (puVar5 + sVar18)[1] = '\x03';
    sendbuf->off = sendbuf->off + 2;
    iVar12 = 0;
  }
  if (iVar12 != 0) {
    return iVar12;
  }
  iVar12 = ptls_buffer_reserve_aligned(sendbuf,0x20,'\0');
  if (iVar12 == 0) {
    puVar5 = sendbuf->base;
    sVar18 = sendbuf->off;
    uVar8 = *client_random;
    uVar9 = *(undefined8 *)((long)client_random + 8);
    uVar10 = *(undefined8 *)((long)client_random + 0x18);
    puVar1 = puVar5 + sVar18 + 0x10;
    *(undefined8 *)puVar1 = *(undefined8 *)((long)client_random + 0x10);
    *(undefined8 *)(puVar1 + 8) = uVar10;
    puVar5 = puVar5 + sVar18;
    *(undefined8 *)puVar5 = uVar8;
    *(undefined8 *)(puVar5 + 8) = uVar9;
    sendbuf->off = sendbuf->off + 0x20;
    iVar12 = 0;
  }
  if (iVar12 != 0) {
    return iVar12;
  }
  iVar12 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
  if (iVar12 == 0) {
    sendbuf->base[sendbuf->off] = '\0';
    sendbuf->off = sendbuf->off + 1;
    iVar12 = 0;
  }
  if (iVar12 == 0) {
    sVar18 = sendbuf->off;
    if ((mode == ENCODE_CH_MODE_ENCODED_INNER) ||
       (iVar12 = ptls_buffer__do_pushv(sendbuf,legacy_session_id.base,legacy_session_id.len),
       iVar12 == 0)) {
      uVar15 = sendbuf->off - sVar18;
      iVar12 = 0;
      if (uVar15 < 0x100) {
        sendbuf->base[sVar18 - 1] = (uint8_t)uVar15;
        bVar24 = true;
        goto LAB_0011d484;
      }
      iVar12 = 0x20c;
    }
    bVar24 = false;
  }
  else {
    bVar24 = false;
  }
LAB_0011d484:
  if (!bVar24) {
    return iVar12;
  }
  iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
  if (iVar12 == 0) {
    puVar5 = sendbuf->base;
    sVar18 = sendbuf->off;
    (puVar5 + sVar18)[0] = '\0';
    (puVar5 + sVar18)[1] = '\0';
    sendbuf->off = sendbuf->off + 2;
    iVar12 = 0;
  }
  bVar24 = false;
  if (iVar12 == 0) {
    sVar18 = sendbuf->off;
    pppVar22 = ctx->cipher_suites;
    ppVar14 = *pppVar22;
    bVar24 = true;
    if (ppVar14 == (ptls_cipher_suite_t *)0x0) {
      iVar12 = 0;
    }
    else {
      do {
        pppVar22 = pppVar22 + 1;
        uVar4 = ppVar14->id;
        iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
        if (iVar12 == 0) {
          *(ushort *)(sendbuf->base + sendbuf->off) = uVar4 << 8 | uVar4 >> 8;
          sendbuf->off = sendbuf->off + 2;
          iVar12 = 0;
        }
        bVar24 = iVar12 == 0;
        if (!bVar24) goto LAB_0011d534;
        ppVar14 = *pppVar22;
      } while (ppVar14 != (ptls_cipher_suite_t *)0x0);
      bVar24 = true;
    }
LAB_0011d534:
    if (bVar24) {
      uVar15 = sendbuf->off - sVar18;
      if (uVar15 < 0x10000) {
        lVar16 = 8;
        do {
          sendbuf->base[sVar18 - 2] = (uint8_t)(uVar15 >> ((byte)lVar16 & 0x3f));
          lVar16 = lVar16 + -8;
          sVar18 = sVar18 + 1;
        } while (lVar16 != -8);
        bVar24 = true;
        goto LAB_0011d577;
      }
      iVar12 = 0x20c;
    }
    bVar24 = false;
  }
LAB_0011d577:
  if (!bVar24) {
    return iVar12;
  }
  iVar12 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
  if (iVar12 == 0) {
    sendbuf->base[sendbuf->off] = '\0';
    sendbuf->off = sendbuf->off + 1;
    iVar12 = 0;
  }
  if (iVar12 == 0) {
    sVar18 = sendbuf->off;
    iVar12 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
    if (iVar12 == 0) {
      sendbuf->base[sendbuf->off] = '\0';
      sendbuf->off = sendbuf->off + 1;
      iVar12 = 0;
    }
    if (iVar12 == 0) {
      uVar15 = sendbuf->off - sVar18;
      iVar12 = 0;
      if (uVar15 < 0x100) {
        sendbuf->base[sVar18 - 1] = (uint8_t)uVar15;
        bVar24 = true;
        goto LAB_0011d5fd;
      }
      iVar12 = 0x20c;
    }
    bVar24 = false;
  }
  else {
    bVar24 = false;
  }
LAB_0011d5fd:
  if (!bVar24) {
    return iVar12;
  }
  iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
  if (iVar12 == 0) {
    puVar5 = sendbuf->base;
    sVar18 = sendbuf->off;
    (puVar5 + sVar18)[0] = '\0';
    (puVar5 + sVar18)[1] = '\0';
    sendbuf->off = sendbuf->off + 2;
    iVar12 = 0;
  }
  local_70 = 6;
  if (iVar12 != 0) goto LAB_0011d636;
  local_40 = sendbuf->off;
  if (mode == ENCODE_CH_MODE_OUTER) {
    iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar12 == 0) {
      puVar5 = sendbuf->base;
      sVar18 = sendbuf->off;
      (puVar5 + sVar18)[0] = 0xfe;
      (puVar5 + sVar18)[1] = '\r';
      sendbuf->off = sendbuf->off + 2;
      iVar12 = 0;
    }
    local_70 = 6;
    if (iVar12 != 0) goto LAB_0011d636;
    iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar12 == 0) {
      puVar5 = sendbuf->base;
      sVar18 = sendbuf->off;
      (puVar5 + sVar18)[0] = '\0';
      (puVar5 + sVar18)[1] = '\0';
      sendbuf->off = sendbuf->off + 2;
      iVar12 = 0;
    }
    local_70 = 6;
    if (iVar12 == 0) {
      sVar18 = sendbuf->off;
      iVar12 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
      if (iVar12 == 0) {
        sendbuf->base[sendbuf->off] = '\0';
        sendbuf->off = sendbuf->off + 1;
        iVar12 = 0;
      }
      local_70 = 6;
      if (iVar12 == 0) {
        uVar4 = (ech->cipher->id).kdf;
        iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
        if (iVar12 == 0) {
          *(ushort *)(sendbuf->base + sendbuf->off) = uVar4 << 8 | uVar4 >> 8;
          sendbuf->off = sendbuf->off + 2;
          iVar12 = 0;
        }
        local_70 = 6;
        if (iVar12 == 0) {
          uVar4 = (ech->cipher->id).aead;
          iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
          if (iVar12 == 0) {
            *(ushort *)(sendbuf->base + sendbuf->off) = uVar4 << 8 | uVar4 >> 8;
            sendbuf->off = sendbuf->off + 2;
            iVar12 = 0;
          }
          local_70 = 6;
          if (iVar12 == 0) {
            uVar2 = ech->config_id;
            iVar12 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
            if (iVar12 == 0) {
              sendbuf->base[sendbuf->off] = uVar2;
              sendbuf->off = sendbuf->off + 1;
              iVar12 = 0;
            }
            local_70 = 6;
            if (iVar12 == 0) {
              iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
              if (iVar12 == 0) {
                puVar5 = sendbuf->base;
                sVar23 = sendbuf->off;
                (puVar5 + sVar23)[0] = '\0';
                (puVar5 + sVar23)[1] = '\0';
                sendbuf->off = sendbuf->off + 2;
                iVar12 = 0;
              }
              local_70 = 6;
              if ((iVar12 == 0) &&
                 ((sVar23 = sendbuf->off, is_second_flight != 0 ||
                  (iVar12 = ptls_buffer__do_pushv
                                      (sendbuf,(ech->client).enc.base,(ech->client).enc.len),
                  iVar12 == 0)))) {
                uVar15 = sendbuf->off - sVar23;
                if (0xffff < uVar15) {
                  iVar12 = 0x20c;
                  goto LAB_0011d827;
                }
                lVar16 = 8;
                do {
                  sendbuf->base[sVar23 - 2] = (uint8_t)(uVar15 >> ((byte)lVar16 & 0x3f));
                  lVar16 = lVar16 + -8;
                  sVar23 = sVar23 + 1;
                } while (lVar16 != -8);
                local_70 = 0;
                bVar24 = true;
                iVar12 = 0;
              }
              else {
LAB_0011d827:
                bVar24 = false;
              }
              if (bVar24) {
                iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
                if (iVar12 == 0) {
                  puVar5 = sendbuf->base;
                  sVar23 = sendbuf->off;
                  (puVar5 + sVar23)[0] = '\0';
                  (puVar5 + sVar23)[1] = '\0';
                  sendbuf->off = sendbuf->off + 2;
                  iVar12 = 0;
                }
                if (iVar12 == 0) {
                  sVar23 = sendbuf->off;
                  lVar16 = 10;
                  if (is_second_flight == 0) {
                    lVar16 = (ech->client).enc.len + 10;
                  }
                  if (sVar23 - sVar18 != lVar16) {
                    __assert_fail("sendbuf->off - ext_payload_from == outer_ech_header_size(is_second_flight ? 0 : ech->client.enc.len)"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                                  ,0x890,
                                  "int encode_client_hello(ptls_context_t *, ptls_buffer_t *, enum encode_ch_mode, int, ptls_handshake_properties_t *, const void *, ptls_key_exchange_context_t *, const char *, ptls_iovec_t, struct st_ptls_ech_t *, size_t *, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, uint32_t, size_t, ptls_iovec_t *, int)"
                                 );
                  }
                  iVar12 = ptls_buffer_reserve_aligned(sendbuf,*ech_size_offset,'\0');
                  if (iVar12 == 0) {
                    memset(sendbuf->base + sendbuf->off,0,*ech_size_offset);
                    sVar20 = sendbuf->off + *ech_size_offset;
                    sendbuf->off = sVar20;
                    *ech_size_offset = sVar20 - *ech_size_offset;
                    uVar15 = sendbuf->off - sVar23;
                    iVar12 = 0x20c;
                    local_70 = 6;
                    if (uVar15 < 0x10000) {
                      lVar16 = 8;
                      do {
                        sendbuf->base[sVar23 - 2] = (uint8_t)(uVar15 >> ((byte)lVar16 & 0x3f));
                        lVar16 = lVar16 + -8;
                        sVar23 = sVar23 + 1;
                        local_70 = 0;
                        iVar12 = 0;
                      } while (lVar16 != -8);
                    }
                    goto LAB_0011d8a5;
                  }
                }
                local_70 = 6;
              }
            }
          }
        }
      }
LAB_0011d8a5:
      if (local_70 == 0) {
        uVar15 = sendbuf->off - sVar18;
        if (uVar15 < 0x10000) {
          lVar16 = 8;
          do {
            sendbuf->base[sVar18 - 2] = (uint8_t)(uVar15 >> ((byte)lVar16 & 0x3f));
            lVar16 = lVar16 + -8;
            sVar18 = sVar18 + 1;
          } while (lVar16 != -8);
          local_70 = 0;
        }
        else {
          iVar12 = 0x20c;
          local_70 = 6;
        }
      }
    }
    if (local_70 != 0) goto LAB_0011d636;
  }
  else {
    if (ech->aead == (ptls_aead_context_t *)0x0) {
      if (ech_replay.base == (uint8_t *)0x0) goto LAB_0011da91;
      iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
      if (iVar12 == 0) {
        puVar5 = sendbuf->base;
        sVar18 = sendbuf->off;
        (puVar5 + sVar18)[0] = 0xfe;
        (puVar5 + sVar18)[1] = '\r';
        sendbuf->off = sendbuf->off + 2;
        iVar12 = 0;
      }
      local_70 = 6;
      if (iVar12 != 0) goto LAB_0011d636;
      iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
      if (iVar12 == 0) {
        puVar5 = sendbuf->base;
        sVar18 = sendbuf->off;
        (puVar5 + sVar18)[0] = '\0';
        (puVar5 + sVar18)[1] = '\0';
        sendbuf->off = sendbuf->off + 2;
        iVar12 = 0;
      }
      local_70 = 6;
      if (iVar12 == 0) {
        sVar18 = sendbuf->off;
        iVar12 = ptls_buffer__do_pushv(sendbuf,ech_replay.base,ech_replay.len);
        if (iVar12 == 0) {
          uVar15 = sendbuf->off - sVar18;
          if (uVar15 < 0x10000) {
            lVar16 = 8;
            do {
              sendbuf->base[sVar18 - 2] = (uint8_t)(uVar15 >> ((byte)lVar16 & 0x3f));
              lVar16 = lVar16 + -8;
              sVar18 = sVar18 + 1;
            } while (lVar16 != -8);
            local_70 = 0;
            bVar24 = true;
            iVar12 = 0;
            goto joined_r0x0011da43;
          }
          iVar12 = 0x20c;
        }
      }
      bVar24 = false;
    }
    else {
      iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
      if (iVar12 == 0) {
        puVar5 = sendbuf->base;
        sVar18 = sendbuf->off;
        (puVar5 + sVar18)[0] = 0xfe;
        (puVar5 + sVar18)[1] = '\r';
        sendbuf->off = sendbuf->off + 2;
        iVar12 = 0;
      }
      local_70 = 6;
      if (iVar12 != 0) goto LAB_0011d636;
      iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
      if (iVar12 == 0) {
        puVar5 = sendbuf->base;
        sVar18 = sendbuf->off;
        (puVar5 + sVar18)[0] = '\0';
        (puVar5 + sVar18)[1] = '\0';
        sendbuf->off = sendbuf->off + 2;
        iVar12 = 0;
      }
      local_70 = 6;
      if (iVar12 == 0) {
        sVar18 = sendbuf->off;
        iVar12 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
        if (iVar12 == 0) {
          sendbuf->base[sendbuf->off] = '\x01';
          sendbuf->off = sendbuf->off + 1;
          iVar12 = 0;
        }
        if (iVar12 == 0) {
          uVar15 = sendbuf->off - sVar18;
          if (uVar15 < 0x10000) {
            lVar16 = 8;
            do {
              sendbuf->base[sVar18 - 2] = (uint8_t)(uVar15 >> ((byte)lVar16 & 0x3f));
              lVar16 = lVar16 + -8;
              sVar18 = sVar18 + 1;
            } while (lVar16 != -8);
            local_70 = 0;
            bVar24 = true;
            iVar12 = 0;
            goto joined_r0x0011da43;
          }
          iVar12 = 0x20c;
        }
      }
      bVar24 = false;
    }
joined_r0x0011da43:
    if (!bVar24) goto LAB_0011d636;
  }
LAB_0011da91:
  iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
  if (mode == ENCODE_CH_MODE_ENCODED_INNER) {
    if (iVar12 == 0) {
      puVar5 = sendbuf->base;
      sVar18 = sendbuf->off;
      (puVar5 + sVar18)[0] = 0xfd;
      (puVar5 + sVar18)[1] = '\0';
      sendbuf->off = sendbuf->off + 2;
      iVar12 = 0;
    }
    local_70 = 6;
    if (iVar12 != 0) goto LAB_0011d636;
    iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar12 == 0) {
      puVar5 = sendbuf->base;
      sVar18 = sendbuf->off;
      (puVar5 + sVar18)[0] = '\0';
      (puVar5 + sVar18)[1] = '\0';
      sendbuf->off = sendbuf->off + 2;
      iVar12 = 0;
    }
    local_70 = 6;
    if (iVar12 == 0) {
      sVar18 = sendbuf->off;
      iVar12 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
      if (iVar12 == 0) {
        sendbuf->base[sendbuf->off] = '\0';
        sendbuf->off = sendbuf->off + 1;
        iVar12 = 0;
      }
      local_70 = 6;
      if (iVar12 == 0) {
        sVar23 = sendbuf->off;
        iVar13 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
        if (iVar13 == 0) {
          puVar5 = sendbuf->base;
          sVar20 = sendbuf->off;
          (puVar5 + sVar20)[0] = '\0';
          (puVar5 + sVar20)[1] = '3';
          sendbuf->off = sendbuf->off + 2;
          iVar13 = 0;
        }
        local_70 = 6;
        iVar12 = iVar13;
        if (iVar13 == 0) {
          uVar15 = sendbuf->off - sVar23;
          iVar12 = 0x20c;
          local_70 = 6;
          if (uVar15 < 0x100) {
            sendbuf->base[sVar23 - 1] = (uint8_t)uVar15;
            local_70 = 0;
            iVar12 = iVar13;
          }
        }
      }
      if (local_70 == 0) {
        uVar15 = sendbuf->off - sVar18;
        if (uVar15 < 0x10000) {
          lVar16 = 8;
          do {
            sendbuf->base[sVar18 - 2] = (uint8_t)(uVar15 >> ((byte)lVar16 & 0x3f));
            lVar16 = lVar16 + -8;
            sVar18 = sVar18 + 1;
          } while (lVar16 != -8);
          local_70 = 0;
        }
        else {
          iVar12 = 0x20c;
          local_70 = 6;
        }
      }
    }
  }
  else {
    if (iVar12 == 0) {
      puVar5 = sendbuf->base;
      sVar18 = sendbuf->off;
      (puVar5 + sVar18)[0] = '\0';
      (puVar5 + sVar18)[1] = '3';
      sendbuf->off = sendbuf->off + 2;
      iVar12 = 0;
    }
    local_70 = 6;
    if (iVar12 != 0) goto LAB_0011d636;
    iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar12 == 0) {
      puVar5 = sendbuf->base;
      sVar18 = sendbuf->off;
      (puVar5 + sVar18)[0] = '\0';
      (puVar5 + sVar18)[1] = '\0';
      sendbuf->off = sendbuf->off + 2;
      iVar12 = 0;
    }
    local_70 = 6;
    if (iVar12 != 0) goto joined_r0x0011dce4;
    sVar18 = sendbuf->off;
    iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar12 == 0) {
      puVar5 = sendbuf->base;
      sVar23 = sendbuf->off;
      (puVar5 + sVar23)[0] = '\0';
      (puVar5 + sVar23)[1] = '\0';
      sendbuf->off = sendbuf->off + 2;
      iVar12 = 0;
    }
    local_70 = 6;
    if ((iVar12 == 0) &&
       ((sVar23 = sendbuf->off, key_share_ctx == (ptls_key_exchange_context_t *)0x0 ||
        (iVar12 = push_key_share_entry(sendbuf,key_share_ctx->algo->id,key_share_ctx->pubkey),
        iVar12 == 0)))) {
      uVar15 = sendbuf->off - sVar23;
      if (0xffff < uVar15) {
        iVar12 = 0x20c;
        goto LAB_0011dc15;
      }
      lVar16 = 8;
      do {
        sendbuf->base[sVar23 - 2] = (uint8_t)(uVar15 >> ((byte)lVar16 & 0x3f));
        lVar16 = lVar16 + -8;
        sVar23 = sVar23 + 1;
      } while (lVar16 != -8);
      local_70 = 0;
      bVar24 = true;
      iVar12 = 0;
    }
    else {
LAB_0011dc15:
      bVar24 = false;
    }
    if (bVar24) {
      uVar15 = sendbuf->off - sVar18;
      if (uVar15 < 0x10000) {
        lVar16 = 8;
        do {
          sendbuf->base[sVar18 - 2] = (uint8_t)(uVar15 >> ((byte)lVar16 & 0x3f));
          lVar16 = lVar16 + -8;
          sVar18 = sVar18 + 1;
        } while (lVar16 != -8);
        local_70 = 0;
      }
      else {
        iVar12 = 0x20c;
        local_70 = 6;
      }
    }
  }
joined_r0x0011dce4:
  if (local_70 != 0) goto LAB_0011d636;
  if (sni_name != (char *)0x0) {
    iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar12 == 0) {
      puVar5 = sendbuf->base;
      sVar18 = sendbuf->off;
      (puVar5 + sVar18)[0] = '\0';
      (puVar5 + sVar18)[1] = '\0';
      sendbuf->off = sendbuf->off + 2;
      iVar12 = 0;
    }
    local_70 = 6;
    if (iVar12 != 0) goto LAB_0011d636;
    iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar12 == 0) {
      puVar5 = sendbuf->base;
      sVar18 = sendbuf->off;
      (puVar5 + sVar18)[0] = '\0';
      (puVar5 + sVar18)[1] = '\0';
      sendbuf->off = sendbuf->off + 2;
      iVar12 = 0;
    }
    local_70 = 6;
    if (iVar12 == 0) {
      sVar18 = sendbuf->off;
      iVar12 = emit_server_name_extension(sendbuf,sni_name);
      if (iVar12 != 0) goto LAB_0011de35;
      uVar15 = sendbuf->off - sVar18;
      if (0xffff < uVar15) {
        iVar12 = 0x20c;
        goto LAB_0011de35;
      }
      lVar16 = 8;
      do {
        sendbuf->base[sVar18 - 2] = (uint8_t)(uVar15 >> ((byte)lVar16 & 0x3f));
        lVar16 = lVar16 + -8;
        sVar18 = sVar18 + 1;
      } while (lVar16 != -8);
      local_70 = 0;
      bVar24 = true;
      iVar12 = 0;
    }
    else {
LAB_0011de35:
      bVar24 = false;
    }
    if (!bVar24) goto LAB_0011d636;
  }
  if ((properties != (ptls_handshake_properties_t *)0x0) &&
     ((properties->field_0).client.negotiated_protocols.count != 0)) {
    iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar12 == 0) {
      puVar5 = sendbuf->base;
      sVar18 = sendbuf->off;
      (puVar5 + sVar18)[0] = '\0';
      (puVar5 + sVar18)[1] = '\x10';
      sendbuf->off = sendbuf->off + 2;
      iVar12 = 0;
    }
    local_70 = 6;
    if (iVar12 != 0) goto LAB_0011d636;
    iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar12 == 0) {
      puVar5 = sendbuf->base;
      sVar18 = sendbuf->off;
      (puVar5 + sVar18)[0] = '\0';
      (puVar5 + sVar18)[1] = '\0';
      sendbuf->off = sendbuf->off + 2;
      iVar12 = 0;
    }
    local_70 = 6;
    if (iVar12 == 0) {
      sVar18 = sendbuf->off;
      iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
      if (iVar12 == 0) {
        puVar5 = sendbuf->base;
        sVar23 = sendbuf->off;
        (puVar5 + sVar23)[0] = '\0';
        (puVar5 + sVar23)[1] = '\0';
        sendbuf->off = sendbuf->off + 2;
        iVar12 = 0;
      }
      local_70 = 6;
      if (iVar12 == 0) {
        sVar23 = sendbuf->off;
        if ((properties->field_0).client.negotiated_protocols.count == 0) {
          local_5c = 0;
          iVar13 = 0;
        }
        else {
          lVar16 = 8;
          sVar20 = 0;
          do {
            iVar13 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
            if (iVar13 == 0) {
              sendbuf->base[sendbuf->off] = '\0';
              sendbuf->off = sendbuf->off + 1;
              iVar13 = 0;
            }
            local_5c = 6;
            if (iVar13 == 0) {
              local_38 = sendbuf->off;
              ppVar6 = (properties->field_0).client.negotiated_protocols.list;
              iVar12 = ptls_buffer__do_pushv
                                 (sendbuf,*(void **)((long)ppVar6 + lVar16 + -8),
                                  *(size_t *)((long)&ppVar6->base + lVar16));
              if (iVar12 == 0) {
                uVar15 = sendbuf->off - local_38;
                iVar13 = 0x20c;
                if (uVar15 < 0x100) {
                  sendbuf->base[local_38 - 1] = (uint8_t)uVar15;
                  local_5c = 0;
                  iVar13 = iVar12;
                }
              }
              else {
                local_5c = 6;
                iVar13 = iVar12;
              }
            }
            if (local_5c != 0) goto LAB_0011e0e5;
            sVar20 = sVar20 + 1;
            lVar16 = lVar16 + 0x10;
          } while (sVar20 != (properties->field_0).client.negotiated_protocols.count);
          local_5c = 0;
        }
LAB_0011e0e5:
        if (local_5c == 0) {
          uVar15 = sendbuf->off - sVar23;
          iVar12 = 0x20c;
          if (uVar15 < 0x10000) {
            lVar16 = 8;
            do {
              sendbuf->base[sVar23 - 2] = (uint8_t)(uVar15 >> ((byte)lVar16 & 0x3f));
              lVar16 = lVar16 + -8;
              sVar23 = sVar23 + 1;
            } while (lVar16 != -8);
            local_70 = 0;
            iVar12 = iVar13;
          }
        }
        else {
          local_70 = local_5c;
          iVar12 = iVar13;
        }
      }
      if (local_70 == 0) {
        uVar15 = sendbuf->off - sVar18;
        if (uVar15 < 0x10000) {
          lVar16 = 8;
          do {
            sendbuf->base[sVar18 - 2] = (uint8_t)(uVar15 >> ((byte)lVar16 & 0x3f));
            lVar16 = lVar16 + -8;
            sVar18 = sVar18 + 1;
          } while (lVar16 != -8);
          local_70 = 0;
        }
        else {
          iVar12 = 0x20c;
          local_70 = 6;
        }
      }
    }
    if (local_70 != 0) goto LAB_0011d636;
  }
  if (ctx->decompress_certificate != (ptls_decompress_certificate_t *)0x0) {
    iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar12 == 0) {
      puVar5 = sendbuf->base;
      sVar18 = sendbuf->off;
      (puVar5 + sVar18)[0] = '\0';
      (puVar5 + sVar18)[1] = '\x1b';
      sendbuf->off = sendbuf->off + 2;
      iVar12 = 0;
    }
    local_70 = 6;
    if (iVar12 != 0) goto LAB_0011d636;
    iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar12 == 0) {
      puVar5 = sendbuf->base;
      sVar18 = sendbuf->off;
      (puVar5 + sVar18)[0] = '\0';
      (puVar5 + sVar18)[1] = '\0';
      sendbuf->off = sendbuf->off + 2;
      iVar12 = 0;
    }
    local_70 = 6;
    if (iVar12 == 0) {
      sVar18 = sendbuf->off;
      iVar12 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
      if (iVar12 == 0) {
        sendbuf->base[sendbuf->off] = '\0';
        sendbuf->off = sendbuf->off + 1;
        iVar12 = 0;
      }
      local_70 = 6;
      if (iVar12 == 0) {
        puVar19 = ctx->decompress_certificate->supported_algorithms;
        if (*puVar19 == 0xffff) {
          __assert_fail("*algo != UINT16_MAX",
                        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                        ,0x8c3,
                        "int encode_client_hello(ptls_context_t *, ptls_buffer_t *, enum encode_ch_mode, int, ptls_handshake_properties_t *, const void *, ptls_key_exchange_context_t *, const char *, ptls_iovec_t, struct st_ptls_ech_t *, size_t *, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, uint32_t, size_t, ptls_iovec_t *, int)"
                       );
        }
        sVar23 = sendbuf->off;
        uVar21 = *puVar19;
        if (uVar21 == 0xffff) {
          local_70 = 0;
          bVar24 = true;
          iVar13 = 0;
        }
        else {
          do {
            puVar19 = puVar19 + 1;
            iVar13 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
            if (iVar13 == 0) {
              *(uint16_t *)(sendbuf->base + sendbuf->off) = uVar21 << 8 | uVar21 >> 8;
              sendbuf->off = sendbuf->off + 2;
              iVar13 = 0;
            }
            bVar24 = iVar13 == 0;
            if (!bVar24) {
              local_70 = 6;
              goto LAB_0011e2d9;
            }
            uVar21 = *puVar19;
          } while (uVar21 != 0xffff);
          local_70 = 0;
        }
LAB_0011e2d9:
        iVar12 = iVar13;
        if (bVar24) {
          uVar15 = sendbuf->off - sVar23;
          iVar12 = 0x20c;
          local_70 = 6;
          if (uVar15 < 0x100) {
            sendbuf->base[sVar23 - 1] = (uint8_t)uVar15;
            local_70 = 0;
            iVar12 = iVar13;
          }
        }
      }
      if (local_70 == 0) {
        uVar15 = sendbuf->off - sVar18;
        if (uVar15 < 0x10000) {
          lVar16 = 8;
          do {
            sendbuf->base[sVar18 - 2] = (uint8_t)(uVar15 >> ((byte)lVar16 & 0x3f));
            lVar16 = lVar16 + -8;
            sVar18 = sVar18 + 1;
          } while (lVar16 != -8);
          local_70 = 0;
        }
        else {
          iVar12 = 0x20c;
          local_70 = 6;
        }
      }
    }
    if (local_70 != 0) goto LAB_0011d636;
  }
  iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
  if (iVar12 == 0) {
    puVar5 = sendbuf->base;
    sVar18 = sendbuf->off;
    (puVar5 + sVar18)[0] = '\0';
    (puVar5 + sVar18)[1] = '+';
    sendbuf->off = sendbuf->off + 2;
    iVar12 = 0;
  }
  local_70 = 6;
  if (iVar12 != 0) goto LAB_0011d636;
  iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
  if (iVar12 == 0) {
    puVar5 = sendbuf->base;
    sVar18 = sendbuf->off;
    (puVar5 + sVar18)[0] = '\0';
    (puVar5 + sVar18)[1] = '\0';
    sendbuf->off = sendbuf->off + 2;
    iVar12 = 0;
  }
  local_70 = 6;
  if (iVar12 == 0) {
    sVar18 = sendbuf->off;
    iVar12 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
    if (iVar12 == 0) {
      sendbuf->base[sendbuf->off] = '\0';
      sendbuf->off = sendbuf->off + 1;
      iVar12 = 0;
    }
    local_70 = 6;
    if (iVar12 == 0) {
      sVar23 = sendbuf->off;
      iVar13 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
      if (iVar13 == 0) {
        puVar5 = sendbuf->base;
        sVar20 = sendbuf->off;
        (puVar5 + sVar20)[0] = '\x03';
        (puVar5 + sVar20)[1] = '\x04';
        sendbuf->off = sendbuf->off + 2;
        iVar13 = 0;
      }
      local_70 = 6;
      iVar12 = iVar13;
      if (iVar13 == 0) {
        uVar15 = sendbuf->off - sVar23;
        iVar12 = 0x20c;
        local_70 = 6;
        if (uVar15 < 0x100) {
          sendbuf->base[sVar23 - 1] = (uint8_t)uVar15;
          local_70 = 0;
          iVar12 = iVar13;
        }
      }
    }
    if (local_70 == 0) {
      uVar15 = sendbuf->off - sVar18;
      if (uVar15 < 0x10000) {
        lVar16 = 8;
        do {
          sendbuf->base[sVar18 - 2] = (uint8_t)(uVar15 >> ((byte)lVar16 & 0x3f));
          lVar16 = lVar16 + -8;
          sVar18 = sVar18 + 1;
        } while (lVar16 != -8);
        local_70 = 0;
      }
      else {
        iVar12 = 0x20c;
        local_70 = 6;
      }
    }
  }
  if (local_70 != 0) goto LAB_0011d636;
  iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
  if (iVar12 == 0) {
    puVar5 = sendbuf->base;
    sVar18 = sendbuf->off;
    (puVar5 + sVar18)[0] = '\0';
    (puVar5 + sVar18)[1] = '\r';
    sendbuf->off = sendbuf->off + 2;
    iVar12 = 0;
  }
  local_70 = 6;
  if (iVar12 != 0) goto LAB_0011d636;
  iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
  if (iVar12 == 0) {
    puVar5 = sendbuf->base;
    sVar18 = sendbuf->off;
    (puVar5 + sVar18)[0] = '\0';
    (puVar5 + sVar18)[1] = '\0';
    sendbuf->off = sendbuf->off + 2;
    iVar12 = 0;
  }
  local_70 = 6;
  if (iVar12 == 0) {
    sVar18 = sendbuf->off;
    iVar12 = push_signature_algorithms(ctx->verify_certificate,sendbuf);
    if (iVar12 != 0) goto LAB_0011e5c5;
    uVar15 = sendbuf->off - sVar18;
    if (0xffff < uVar15) {
      iVar12 = 0x20c;
      goto LAB_0011e5c5;
    }
    lVar16 = 8;
    do {
      sendbuf->base[sVar18 - 2] = (uint8_t)(uVar15 >> ((byte)lVar16 & 0x3f));
      lVar16 = lVar16 + -8;
      sVar18 = sVar18 + 1;
    } while (lVar16 != -8);
    local_70 = 0;
    bVar24 = true;
    iVar12 = 0;
  }
  else {
LAB_0011e5c5:
    bVar24 = false;
  }
  if (!bVar24) goto LAB_0011d636;
  if (ctx->key_exchanges != (ptls_key_exchange_algorithm_t **)0x0) {
    iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar12 == 0) {
      puVar5 = sendbuf->base;
      sVar18 = sendbuf->off;
      (puVar5 + sVar18)[0] = '\0';
      (puVar5 + sVar18)[1] = '\n';
      sendbuf->off = sendbuf->off + 2;
      iVar12 = 0;
    }
    local_70 = 6;
    if (iVar12 != 0) goto LAB_0011d636;
    iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar12 == 0) {
      puVar5 = sendbuf->base;
      sVar18 = sendbuf->off;
      (puVar5 + sVar18)[0] = '\0';
      (puVar5 + sVar18)[1] = '\0';
      sendbuf->off = sendbuf->off + 2;
      iVar12 = 0;
    }
    local_70 = 6;
    if (iVar12 == 0) {
      sVar18 = sendbuf->off;
      local_78 = ctx->key_exchanges;
      iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
      if (iVar12 == 0) {
        puVar5 = sendbuf->base;
        sVar23 = sendbuf->off;
        (puVar5 + sVar23)[0] = '\0';
        (puVar5 + sVar23)[1] = '\0';
        sendbuf->off = sendbuf->off + 2;
        iVar12 = 0;
      }
      local_70 = 6;
      if (iVar12 == 0) {
        sVar23 = sendbuf->off;
        ppVar7 = *local_78;
        iVar12 = 0;
        while (ppVar7 != (ptls_key_exchange_algorithm_t *)0x0) {
          local_78 = local_78 + 1;
          uVar4 = ppVar7->id;
          iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
          if (iVar12 == 0) {
            *(ushort *)(sendbuf->base + sendbuf->off) = uVar4 << 8 | uVar4 >> 8;
            sendbuf->off = sendbuf->off + 2;
            iVar12 = 0;
          }
          if (iVar12 != 0) goto LAB_0011e744;
          ppVar7 = *local_78;
        }
        uVar15 = sendbuf->off - sVar23;
        if (uVar15 < 0x10000) {
          lVar16 = 8;
          do {
            sendbuf->base[sVar23 - 2] = (uint8_t)(uVar15 >> ((byte)lVar16 & 0x3f));
            lVar16 = lVar16 + -8;
            sVar23 = sVar23 + 1;
          } while (lVar16 != -8);
          local_70 = 0;
          bVar24 = true;
        }
        else {
          iVar12 = 0x20c;
LAB_0011e744:
          bVar24 = false;
        }
      }
      else {
        bVar24 = false;
      }
      if (bVar24) {
        uVar15 = sendbuf->off - sVar18;
        if (uVar15 < 0x10000) {
          lVar16 = 8;
          do {
            sendbuf->base[sVar18 - 2] = (uint8_t)(uVar15 >> ((byte)lVar16 & 0x3f));
            lVar16 = lVar16 + -8;
            sVar18 = sVar18 + 1;
          } while (lVar16 != -8);
          local_70 = 0;
        }
        else {
          iVar12 = 0x20c;
          local_70 = 6;
        }
      }
    }
    if (local_70 != 0) goto LAB_0011d636;
  }
  if ((cookie != (ptls_iovec_t *)0x0) && (cookie->base != (uint8_t *)0x0)) {
    iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar12 == 0) {
      puVar5 = sendbuf->base;
      sVar18 = sendbuf->off;
      (puVar5 + sVar18)[0] = '\0';
      (puVar5 + sVar18)[1] = ',';
      sendbuf->off = sendbuf->off + 2;
      iVar12 = 0;
    }
    local_70 = 6;
    if (iVar12 != 0) goto LAB_0011d636;
    iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar12 == 0) {
      puVar5 = sendbuf->base;
      sVar18 = sendbuf->off;
      (puVar5 + sVar18)[0] = '\0';
      (puVar5 + sVar18)[1] = '\0';
      sendbuf->off = sendbuf->off + 2;
      iVar12 = 0;
    }
    local_70 = 6;
    if (iVar12 == 0) {
      sVar18 = sendbuf->off;
      iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
      if (iVar12 == 0) {
        puVar5 = sendbuf->base;
        sVar23 = sendbuf->off;
        (puVar5 + sVar23)[0] = '\0';
        (puVar5 + sVar23)[1] = '\0';
        sendbuf->off = sendbuf->off + 2;
        iVar12 = 0;
      }
      local_70 = 6;
      if (iVar12 == 0) {
        sVar23 = sendbuf->off;
        iVar12 = ptls_buffer__do_pushv(sendbuf,cookie->base,cookie->len);
        if (iVar12 != 0) goto LAB_0011e8c8;
        uVar15 = sendbuf->off - sVar23;
        if (0xffff < uVar15) {
          iVar12 = 0x20c;
          goto LAB_0011e8c8;
        }
        lVar16 = 8;
        do {
          sendbuf->base[sVar23 - 2] = (uint8_t)(uVar15 >> ((byte)lVar16 & 0x3f));
          lVar16 = lVar16 + -8;
          sVar23 = sVar23 + 1;
        } while (lVar16 != -8);
        local_70 = 0;
        bVar24 = true;
        iVar12 = 0;
      }
      else {
LAB_0011e8c8:
        bVar24 = false;
      }
      if (bVar24) {
        uVar15 = sendbuf->off - sVar18;
        if (uVar15 < 0x10000) {
          lVar16 = 8;
          do {
            sendbuf->base[sVar18 - 2] = (uint8_t)(uVar15 >> ((byte)lVar16 & 0x3f));
            lVar16 = lVar16 + -8;
            sVar18 = sVar18 + 1;
          } while (lVar16 != -8);
          local_70 = 0;
        }
        else {
          iVar12 = 0x20c;
          local_70 = 6;
        }
      }
    }
    if (local_70 != 0) goto LAB_0011d636;
  }
  if ((ctx->field_0xb8 & 0x20) != 0) {
    iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar12 == 0) {
      puVar5 = sendbuf->base;
      sVar18 = sendbuf->off;
      (puVar5 + sVar18)[0] = '\0';
      (puVar5 + sVar18)[1] = '\x14';
      sendbuf->off = sendbuf->off + 2;
      iVar12 = 0;
    }
    local_70 = 6;
    if (iVar12 != 0) goto LAB_0011d636;
    iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar12 == 0) {
      puVar5 = sendbuf->base;
      sVar18 = sendbuf->off;
      (puVar5 + sVar18)[0] = '\0';
      (puVar5 + sVar18)[1] = '\0';
      sendbuf->off = sendbuf->off + 2;
      iVar12 = 0;
    }
    local_70 = 6;
    if (iVar12 == 0) {
      sVar18 = sendbuf->off;
      iVar12 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
      if (iVar12 == 0) {
        sendbuf->base[sendbuf->off] = '\0';
        sendbuf->off = sendbuf->off + 1;
        iVar12 = 0;
      }
      local_70 = 6;
      if (iVar12 == 0) {
        sVar23 = sendbuf->off;
        iVar12 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
        if (iVar12 == 0) {
          sendbuf->base[sendbuf->off] = '\x02';
          sendbuf->off = sendbuf->off + 1;
          iVar12 = 0;
        }
        if (iVar12 != 0) goto LAB_0011eb48;
        uVar15 = sendbuf->off - sVar23;
        iVar12 = 0;
        if (0xff < uVar15) {
          iVar12 = 0x20c;
          goto LAB_0011eb48;
        }
        sendbuf->base[sVar23 - 1] = (uint8_t)uVar15;
        bVar24 = true;
        local_70 = 0;
      }
      else {
LAB_0011eb48:
        bVar24 = false;
      }
      if (bVar24) {
        uVar15 = sendbuf->off - sVar18;
        if (uVar15 < 0x10000) {
          lVar16 = 8;
          do {
            sendbuf->base[sVar18 - 2] = (uint8_t)(uVar15 >> ((byte)lVar16 & 0x3f));
            lVar16 = lVar16 + -8;
            sVar18 = sVar18 + 1;
          } while (lVar16 != -8);
          local_70 = 0;
        }
        else {
          iVar12 = 0x20c;
          local_70 = 6;
        }
      }
    }
    if (local_70 != 0) goto LAB_0011d636;
  }
  if ((ctx->save_ticket != (ptls_save_ticket_t *)0x0) &&
     (((ctx->ticket_requests).client.new_session_count != '\0' ||
      ((ctx->ticket_requests).client.resumption_count != '\0')))) {
    iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar12 == 0) {
      puVar5 = sendbuf->base;
      sVar18 = sendbuf->off;
      (puVar5 + sVar18)[0] = '\0';
      (puVar5 + sVar18)[1] = ':';
      sendbuf->off = sendbuf->off + 2;
      iVar12 = 0;
    }
    local_70 = 6;
    if (iVar12 != 0) goto LAB_0011d636;
    iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar12 == 0) {
      puVar5 = sendbuf->base;
      sVar18 = sendbuf->off;
      (puVar5 + sVar18)[0] = '\0';
      (puVar5 + sVar18)[1] = '\0';
      sendbuf->off = sendbuf->off + 2;
      iVar12 = 0;
    }
    local_70 = 6;
    if (iVar12 == 0) {
      sVar18 = sendbuf->off;
      uVar2 = (ctx->ticket_requests).client.new_session_count;
      uVar3 = (ctx->ticket_requests).client.resumption_count;
      iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
      if (iVar12 == 0) {
        puVar5 = sendbuf->base;
        sVar23 = sendbuf->off;
        puVar5[sVar23] = uVar2;
        puVar5[sVar23 + 1] = uVar3;
        sendbuf->off = sendbuf->off + 2;
        iVar12 = 0;
      }
      if (iVar12 != 0) goto LAB_0011ea2e;
      uVar15 = sendbuf->off - sVar18;
      if (0xffff < uVar15) {
        iVar12 = 0x20c;
        goto LAB_0011ea2e;
      }
      lVar16 = 8;
      do {
        sendbuf->base[sVar18 - 2] = (uint8_t)(uVar15 >> ((byte)lVar16 & 0x3f));
        lVar16 = lVar16 + -8;
        sVar18 = sVar18 + 1;
      } while (lVar16 != -8);
      local_70 = 0;
      bVar24 = true;
      iVar12 = 0;
    }
    else {
LAB_0011ea2e:
      bVar24 = false;
    }
    if (!bVar24) goto LAB_0011d636;
  }
  iVar12 = push_additional_extensions(properties,sendbuf);
  if (iVar12 != 0) {
    local_70 = 6;
    goto LAB_0011d636;
  }
  iVar13 = 0;
  if (ctx->save_ticket != (ptls_save_ticket_t *)0x0 || psk_secret.base != (uint8_t *)0x0) {
    iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar12 == 0) {
      puVar5 = sendbuf->base;
      sVar18 = sendbuf->off;
      (puVar5 + sVar18)[0] = '\0';
      (puVar5 + sVar18)[1] = '-';
      sendbuf->off = sendbuf->off + 2;
      iVar12 = 0;
    }
    local_70 = 6;
    if (iVar12 != 0) goto LAB_0011d636;
    iVar13 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar13 == 0) {
      puVar5 = sendbuf->base;
      sVar18 = sendbuf->off;
      (puVar5 + sVar18)[0] = '\0';
      (puVar5 + sVar18)[1] = '\0';
      sendbuf->off = sendbuf->off + 2;
      iVar13 = 0;
    }
    local_70 = 6;
    if (iVar13 == 0) {
      sVar18 = sendbuf->off;
      iVar13 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
      if (iVar13 == 0) {
        sendbuf->base[sendbuf->off] = '\0';
        sendbuf->off = sendbuf->off + 1;
        iVar13 = 0;
      }
      local_70 = 6;
      if (iVar13 == 0) {
        sVar23 = sendbuf->off;
        if ((ctx->field_0xb8 & 1) == 0) {
          iVar13 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
          if (iVar13 == 0) {
            sendbuf->base[sendbuf->off] = '\0';
            sendbuf->off = sendbuf->off + 1;
            iVar13 = 0;
          }
          if (iVar13 != 0) goto LAB_0011ecc4;
        }
        iVar13 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
        if (iVar13 == 0) {
          sendbuf->base[sendbuf->off] = '\x01';
          sendbuf->off = sendbuf->off + 1;
          iVar13 = 0;
        }
        if (iVar13 != 0) goto LAB_0011ecc4;
        uVar15 = sendbuf->off - sVar23;
        iVar13 = 0;
        if (0xff < uVar15) {
          iVar13 = 0x20c;
          goto LAB_0011ecc4;
        }
        sendbuf->base[sVar23 - 1] = (uint8_t)uVar15;
        bVar24 = true;
        local_70 = 0;
      }
      else {
LAB_0011ecc4:
        bVar24 = false;
      }
      if (bVar24) {
        uVar15 = sendbuf->off - sVar18;
        if (uVar15 < 0x10000) {
          lVar16 = 8;
          do {
            sendbuf->base[sVar18 - 2] = (uint8_t)(uVar15 >> ((byte)lVar16 & 0x3f));
            lVar16 = lVar16 + -8;
            sVar18 = sVar18 + 1;
          } while (lVar16 != -8);
          local_70 = 0;
        }
        else {
          iVar13 = 0x20c;
          local_70 = 6;
        }
      }
    }
    iVar12 = iVar13;
    if (local_70 != 0) goto LAB_0011d636;
  }
  if (psk_secret.base != (uint8_t *)0x0) {
    if (is_second_flight == 0 && using_early_data != 0) {
      iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
      if (iVar12 == 0) {
        puVar5 = sendbuf->base;
        sVar18 = sendbuf->off;
        (puVar5 + sVar18)[0] = '\0';
        (puVar5 + sVar18)[1] = '*';
        sendbuf->off = sendbuf->off + 2;
        iVar12 = 0;
      }
      local_70 = 6;
      if (iVar12 != 0) goto LAB_0011d636;
      iVar13 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
      if (iVar13 == 0) {
        puVar5 = sendbuf->base;
        sVar18 = sendbuf->off;
        (puVar5 + sVar18)[0] = '\0';
        (puVar5 + sVar18)[1] = '\0';
        sendbuf->off = sendbuf->off + 2;
        iVar13 = 0;
      }
      local_70 = 6;
      iVar12 = iVar13;
      if (iVar13 == 0) {
        sVar18 = sendbuf->off;
        lVar16 = -2;
        do {
          sendbuf->base[lVar16 + sVar18] = '\0';
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0);
        local_70 = 0;
        iVar12 = 0;
      }
      if (iVar13 != 0) goto LAB_0011d636;
    }
    iVar12 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar12 == 0) {
      puVar5 = sendbuf->base;
      sVar18 = sendbuf->off;
      (puVar5 + sVar18)[0] = '\0';
      (puVar5 + sVar18)[1] = ')';
      sendbuf->off = sendbuf->off + 2;
      iVar12 = 0;
    }
    local_70 = 6;
    if (iVar12 != 0) goto LAB_0011d636;
    iVar13 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar13 == 0) {
      puVar5 = sendbuf->base;
      sVar18 = sendbuf->off;
      (puVar5 + sVar18)[0] = '\0';
      (puVar5 + sVar18)[1] = '\0';
      sendbuf->off = sendbuf->off + 2;
      iVar13 = 0;
    }
    local_70 = 6;
    if (iVar13 == 0) {
      local_58 = sendbuf->off;
      iVar13 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
      if (iVar13 == 0) {
        puVar5 = sendbuf->base;
        sVar18 = sendbuf->off;
        (puVar5 + sVar18)[0] = '\0';
        (puVar5 + sVar18)[1] = '\0';
        sendbuf->off = sendbuf->off + 2;
        iVar13 = 0;
      }
      local_70 = 6;
      if (iVar13 == 0) {
        sVar18 = sendbuf->off;
        iVar13 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
        if (iVar13 == 0) {
          puVar5 = sendbuf->base;
          sVar23 = sendbuf->off;
          (puVar5 + sVar23)[0] = '\0';
          (puVar5 + sVar23)[1] = '\0';
          sendbuf->off = sendbuf->off + 2;
          iVar13 = 0;
        }
        local_70 = 6;
        if (iVar13 == 0) {
          sVar23 = sendbuf->off;
          if (mode != ENCODE_CH_MODE_OUTER) {
            iVar13 = ptls_buffer__do_pushv(sendbuf,psk_identity.base,psk_identity.len);
            if (iVar13 == 0) goto LAB_0011f15f;
            goto LAB_0011eed7;
          }
          bVar24 = false;
          iVar13 = ptls_buffer_reserve_aligned(sendbuf,psk_identity.len,'\0');
          if (iVar13 == 0) {
            (*ctx->random_bytes)(sendbuf->base + sendbuf->off,psk_identity.len);
            sendbuf->off = sendbuf->off + psk_identity.len;
LAB_0011f15f:
            uVar15 = sendbuf->off - sVar23;
            if (0xffff < uVar15) {
              iVar13 = 0x20c;
              goto LAB_0011eed7;
            }
            lVar16 = 8;
            do {
              sendbuf->base[sVar23 - 2] = (uint8_t)(uVar15 >> ((byte)lVar16 & 0x3f));
              lVar16 = lVar16 + -8;
              sVar23 = sVar23 + 1;
            } while (lVar16 != -8);
            local_70 = 0;
            bVar24 = true;
            iVar13 = 0;
          }
        }
        else {
LAB_0011eed7:
          bVar24 = false;
        }
        if (bVar24) {
          if (mode == ENCODE_CH_MODE_OUTER) {
            (*ctx->random_bytes)(&local_44,4);
          }
          else {
            local_44 = obfuscated_ticket_age;
          }
          uVar11 = local_44;
          iVar12 = ptls_buffer_reserve_aligned(sendbuf,4,'\0');
          if (iVar12 == 0) {
            *(uint *)(sendbuf->base + sendbuf->off) =
                 uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18
            ;
            sendbuf->off = sendbuf->off + 4;
            iVar12 = 0;
          }
          local_70 = 6;
          iVar13 = iVar12;
          if (iVar12 == 0) {
            uVar15 = sendbuf->off - sVar18;
            local_70 = 6;
            iVar13 = 0x20c;
            if (uVar15 < 0x10000) {
              lVar16 = 8;
              do {
                sendbuf->base[sVar18 - 2] = (uint8_t)(uVar15 >> ((byte)lVar16 & 0x3f));
                lVar16 = lVar16 + -8;
                sVar18 = sVar18 + 1;
              } while (lVar16 != -8);
              local_70 = 0;
              iVar13 = iVar12;
            }
          }
        }
      }
      if (local_70 == 0) {
        iVar13 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
        if (iVar13 == 0) {
          puVar5 = sendbuf->base;
          sVar18 = sendbuf->off;
          (puVar5 + sVar18)[0] = '\0';
          (puVar5 + sVar18)[1] = '\0';
          sendbuf->off = sendbuf->off + 2;
          iVar13 = 0;
        }
        local_70 = 6;
        if (iVar13 == 0) {
          sVar18 = sendbuf->off;
          iVar13 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
          if (iVar13 == 0) {
            sendbuf->base[sendbuf->off] = '\0';
            sendbuf->off = sendbuf->off + 1;
            iVar13 = 0;
          }
          local_70 = 6;
          if (iVar13 == 0) {
            sVar23 = sendbuf->off;
            bVar24 = false;
            iVar13 = ptls_buffer_reserve_aligned(sendbuf,psk_binder_size,'\0');
            if (iVar13 == 0) {
              (*ctx->random_bytes)(sendbuf->base + sendbuf->off,psk_binder_size);
              sVar20 = psk_binder_size + sendbuf->off;
              sendbuf->off = sVar20;
              uVar15 = sVar20 - sVar23;
              iVar13 = 0;
              if (0xff < uVar15) {
                iVar13 = 0x20c;
                goto LAB_0011f113;
              }
              sendbuf->base[sVar23 - 1] = (uint8_t)uVar15;
              bVar24 = true;
              local_70 = 0;
            }
          }
          else {
LAB_0011f113:
            bVar24 = false;
          }
          if (bVar24) {
            uVar15 = sendbuf->off - sVar18;
            if (uVar15 < 0x10000) {
              lVar16 = 8;
              do {
                sendbuf->base[sVar18 - 2] = (uint8_t)(uVar15 >> ((byte)lVar16 & 0x3f));
                lVar16 = lVar16 + -8;
                sVar18 = sVar18 + 1;
              } while (lVar16 != -8);
              local_70 = 0;
            }
            else {
              iVar13 = 0x20c;
              local_70 = 6;
            }
          }
        }
        if (local_70 == 0) {
          uVar15 = sendbuf->off - local_58;
          if (uVar15 < 0x10000) {
            lVar16 = 8;
            local_70 = 0;
            do {
              sendbuf->base[local_58 - 2] = (uint8_t)(uVar15 >> ((byte)lVar16 & 0x3f));
              lVar16 = lVar16 + -8;
              local_58 = local_58 + 1;
            } while (lVar16 != -8);
          }
          else {
            iVar13 = 0x20c;
            local_70 = 6;
          }
        }
      }
    }
    iVar12 = iVar13;
    if (local_70 != 0) goto LAB_0011d636;
  }
  uVar15 = sendbuf->off - local_40;
  local_70 = 6;
  iVar12 = 0x20c;
  if (uVar15 < 0x10000) {
    lVar16 = 8;
    do {
      sendbuf->base[local_40 - 2] = (uint8_t)(uVar15 >> ((byte)lVar16 & 0x3f));
      lVar16 = lVar16 + -8;
      local_40 = local_40 + 1;
    } while (lVar16 != -8);
    local_70 = 0;
    iVar12 = iVar13;
  }
LAB_0011d636:
  iVar13 = iVar12;
  if (local_70 == 0) {
    uVar15 = sendbuf->off - sVar17;
    iVar13 = 0x20c;
    if (uVar15 < 0x1000000) {
      lVar16 = 0x10;
      do {
        sendbuf->base[sVar17 - 3] = (uint8_t)(uVar15 >> ((byte)lVar16 & 0x3f));
        lVar16 = lVar16 + -8;
        sVar17 = sVar17 + 1;
        iVar13 = iVar12;
      } while (lVar16 != -8);
    }
  }
  return iVar13;
}

Assistant:

static int encode_client_hello(ptls_context_t *ctx, ptls_buffer_t *sendbuf, enum encode_ch_mode mode, int is_second_flight,
                               ptls_handshake_properties_t *properties, const void *client_random,
                               ptls_key_exchange_context_t *key_share_ctx, const char *sni_name, ptls_iovec_t legacy_session_id,
                               struct st_ptls_ech_t *ech, size_t *ech_size_offset, ptls_iovec_t ech_replay, ptls_iovec_t psk_secret,
                               ptls_iovec_t psk_identity, uint32_t obfuscated_ticket_age, size_t psk_binder_size,
                               ptls_iovec_t *cookie, int using_early_data)
{
    int ret;

    assert(mode == ENCODE_CH_MODE_INNER || ech != NULL);

    ptls_buffer_push_message_body(sendbuf, NULL, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, {
        /* legacy_version */
        ptls_buffer_push16(sendbuf, 0x0303);
        /* random_bytes */
        ptls_buffer_pushv(sendbuf, client_random, PTLS_HELLO_RANDOM_SIZE);
        /* lecagy_session_id */
        ptls_buffer_push_block(sendbuf, 1, {
            if (mode != ENCODE_CH_MODE_ENCODED_INNER)
                ptls_buffer_pushv(sendbuf, legacy_session_id.base, legacy_session_id.len);
        });
        /* cipher_suites */
        ptls_buffer_push_block(sendbuf, 2, {
            ptls_cipher_suite_t **cs = ctx->cipher_suites;
            for (; *cs != NULL; ++cs)
                ptls_buffer_push16(sendbuf, (*cs)->id);
        });
        /* legacy_compression_methods */
        ptls_buffer_push_block(sendbuf, 1, { ptls_buffer_push(sendbuf, 0); });
        /* extensions */
        ptls_buffer_push_block(sendbuf, 2, {
            if (mode == ENCODE_CH_MODE_OUTER) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ENCRYPTED_CLIENT_HELLO, {
                    size_t ext_payload_from = sendbuf->off;
                    ptls_buffer_push(sendbuf, PTLS_ECH_CLIENT_HELLO_TYPE_OUTER);
                    ptls_buffer_push16(sendbuf, ech->cipher->id.kdf);
                    ptls_buffer_push16(sendbuf, ech->cipher->id.aead);
                    ptls_buffer_push(sendbuf, ech->config_id);
                    ptls_buffer_push_block(sendbuf, 2, {
                        if (!is_second_flight)
                            ptls_buffer_pushv(sendbuf, ech->client.enc.base, ech->client.enc.len);
                    });
                    ptls_buffer_push_block(sendbuf, 2, {
                        assert(sendbuf->off - ext_payload_from ==
                               outer_ech_header_size(is_second_flight ? 0 : ech->client.enc.len));
                        if ((ret = ptls_buffer_reserve(sendbuf, *ech_size_offset)) != 0)
                            goto Exit;
                        memset(sendbuf->base + sendbuf->off, 0, *ech_size_offset);
                        sendbuf->off += *ech_size_offset;
                        *ech_size_offset = sendbuf->off - *ech_size_offset;
                    });
                });
            } else if (ech->aead != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ENCRYPTED_CLIENT_HELLO,
                                      { ptls_buffer_push(sendbuf, PTLS_ECH_CLIENT_HELLO_TYPE_INNER); });
            } else if (ech_replay.base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ENCRYPTED_CLIENT_HELLO,
                                      { ptls_buffer_pushv(sendbuf, ech_replay.base, ech_replay.len); });
            }
            if (mode == ENCODE_CH_MODE_ENCODED_INNER) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ECH_OUTER_EXTENSIONS, {
                    ptls_buffer_push_block(sendbuf, 1, { ptls_buffer_push16(sendbuf, PTLS_EXTENSION_TYPE_KEY_SHARE); });
                });
            } else {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_KEY_SHARE, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        if (key_share_ctx != NULL &&
                            (ret = push_key_share_entry(sendbuf, key_share_ctx->algo->id, key_share_ctx->pubkey)) != 0)
                            goto Exit;
                    });
                });
            }
            if (sni_name != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_NAME, {
                    if ((ret = emit_server_name_extension(sendbuf, sni_name)) != 0)
                        goto Exit;
                });
            }
            if (properties != NULL && properties->client.negotiated_protocols.count != 0) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ALPN, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        size_t i;
                        for (i = 0; i != properties->client.negotiated_protocols.count; ++i) {
                            ptls_buffer_push_block(sendbuf, 1, {
                                ptls_iovec_t p = properties->client.negotiated_protocols.list[i];
                                ptls_buffer_pushv(sendbuf, p.base, p.len);
                            });
                        }
                    });
                });
            }
            if (ctx->decompress_certificate != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COMPRESS_CERTIFICATE, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        const uint16_t *algo = ctx->decompress_certificate->supported_algorithms;
                        assert(*algo != UINT16_MAX);
                        for (; *algo != UINT16_MAX; ++algo)
                            ptls_buffer_push16(sendbuf, *algo);
                    });
                });
            }
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS, {
                ptls_buffer_push_block(sendbuf, 1, {
                    size_t i;
                    for (i = 0; i != PTLS_ELEMENTSOF(supported_versions); ++i)
                        ptls_buffer_push16(sendbuf, supported_versions[i]);
                });
            });
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SIGNATURE_ALGORITHMS, {
                if ((ret = push_signature_algorithms(ctx->verify_certificate, sendbuf)) != 0)
                    goto Exit;
            });
            if (ctx->key_exchanges != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_GROUPS, {
                    ptls_key_exchange_algorithm_t **algo = ctx->key_exchanges;
                    ptls_buffer_push_block(sendbuf, 2, {
                        for (; *algo != NULL; ++algo)
                            ptls_buffer_push16(sendbuf, (*algo)->id);
                    });
                });
            }
            if (cookie != NULL && cookie->base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COOKIE, {
                    ptls_buffer_push_block(sendbuf, 2, { ptls_buffer_pushv(sendbuf, cookie->base, cookie->len); });
                });
            }
            if (ctx->use_raw_public_keys) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_CERTIFICATE_TYPE, {
                    ptls_buffer_push_block(sendbuf, 1, { ptls_buffer_push(sendbuf, PTLS_CERTIFICATE_TYPE_RAW_PUBLIC_KEY); });
                });
            }
            if (ctx->save_ticket != NULL &&
                (ctx->ticket_requests.client.new_session_count != 0 || ctx->ticket_requests.client.resumption_count != 0)) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_TICKET_REQUEST, {
                    ptls_buffer_push(sendbuf, ctx->ticket_requests.client.new_session_count,
                                     ctx->ticket_requests.client.resumption_count);
                });
            }
            if ((ret = push_additional_extensions(properties, sendbuf)) != 0)
                goto Exit;
            if (ctx->save_ticket != NULL || psk_secret.base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PSK_KEY_EXCHANGE_MODES, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        if (!ctx->require_dhe_on_psk)
                            ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK);
                        ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK_DHE);
                    });
                });
            }
            if (psk_secret.base != NULL) {
                if (using_early_data && !is_second_flight)
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_EARLY_DATA, {});
                /* pre-shared key "MUST be the last extension in the ClientHello" (draft-17 section 4.2.6) */
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PRE_SHARED_KEY, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 2, {
                            if (mode == ENCODE_CH_MODE_OUTER) {
                                if ((ret = ptls_buffer_reserve(sendbuf, psk_identity.len)) != 0)
                                    goto Exit;
                                ctx->random_bytes(sendbuf->base + sendbuf->off, psk_identity.len);
                                sendbuf->off += psk_identity.len;
                            } else {
                                ptls_buffer_pushv(sendbuf, psk_identity.base, psk_identity.len);
                            }
                        });
                        uint32_t age;
                        if (mode == ENCODE_CH_MODE_OUTER) {
                            ctx->random_bytes(&age, sizeof(age));
                        } else {
                            age = obfuscated_ticket_age;
                        }
                        ptls_buffer_push32(sendbuf, age);
                    });
                    /* allocate space for PSK binder. The space is filled initially filled by a random value (meeting the
                     * requirement of ClientHelloOuter), and later gets filled with the correct binder value if necessary. */
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 1, {
                            if ((ret = ptls_buffer_reserve(sendbuf, psk_binder_size)) != 0)
                                goto Exit;
                            ctx->random_bytes(sendbuf->base + sendbuf->off, psk_binder_size);
                            sendbuf->off += psk_binder_size;
                        });
                    });
                });
            }
        });
    });

Exit:
    return ret;
}